

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

void __thiscall CDBWrapper::CDBWrapper(CDBWrapper *this,DBParams *params)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value;
  long lVar1;
  ulong uVar2;
  pointer puVar3;
  string_view source_file;
  bool bVar4;
  LevelDBContext *pLVar5;
  Logger *pLVar6;
  Env *pEVar7;
  LevelDBContext *pLVar8;
  long lVar9;
  Level level;
  DBParams *pDVar10;
  Options *pOVar11;
  string *this_00;
  LogFlags category;
  Options *pOVar12;
  int *in_R8;
  long in_FS_OFFSET;
  byte bVar13;
  string_view str;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view logging_function_06;
  char *in_stack_fffffffffffffe70;
  char *fmt;
  Elf64_Ehdr *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int local_168 [2];
  Options options;
  path local_100 [2];
  Status status;
  vector<unsigned_char,_std::allocator<unsigned_char>_> new_key;
  string log_msg;
  
  bVar13 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<LevelDBContext>();
  std::filesystem::__cxx11::path::stem(local_100,(path *)params);
  std::filesystem::__cxx11::path::path((path *)&options,local_100);
  std::filesystem::__cxx11::path::string(&this->m_name,(path *)&options);
  std::filesystem::__cxx11::path::~path((path *)&options);
  std::filesystem::__cxx11::path::~path(local_100);
  value = &this->obfuscate_key;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar10 = params;
  std::filesystem::__cxx11::path::path(&(this->m_path).super_path,(path *)params);
  level = (Level)pDVar10;
  this->m_is_memory = params->memory_only;
  pLVar5 = DBContext(this);
  pLVar5->penv = (Env *)0x0;
  pLVar5 = DBContext(this);
  (pLVar5->readoptions).verify_checksums = true;
  pLVar5 = DBContext(this);
  (pLVar5->iteroptions).verify_checksums = true;
  pLVar5 = DBContext(this);
  (pLVar5->iteroptions).fill_cache = false;
  pLVar5 = DBContext(this);
  (pLVar5->syncoptions).sync = true;
  uVar2 = params->cache_bytes;
  leveldb::Options::Options(&options);
  options.block_cache = leveldb::NewLRUCache(uVar2 >> 1);
  options.write_buffer_size = uVar2 >> 2;
  options.filter_policy = leveldb::NewBloomFilterPolicy(10);
  options.compression = kNoCompression;
  category = HTTP;
  options.info_log = (Logger *)operator_new(8);
  (options.info_log)->_vptr_Logger = (_func_int **)&PTR__Logger_00a249d8;
  options.paranoid_checks = true;
  local_168[0] = options.max_open_files;
  bVar4 = ::LogAcceptCategory(category,level);
  if (bVar4) {
    pLVar6 = LogInstance();
    bVar4 = BCLog::Logger::Enabled(pLVar6);
    if (bVar4) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<int,int>
                ((string *)&new_key,(tinyformat *)"LevelDB using max_open_files=%d (default=%d)\n",
                 (char *)&options.max_open_files,local_168,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &new_key);
      std::__cxx11::string::~string((string *)&new_key);
      pLVar6 = LogInstance();
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x56;
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      in_stack_fffffffffffffe70 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      in_stack_fffffffffffffe80 = 1;
      in_stack_fffffffffffffe78 = &__cxx_global_var_init_1;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file._M_len = 0x56;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function_06._M_str = "SetMaxOpenFiles";
      logging_function_06._M_len = 0xf;
      BCLog::Logger::LogPrintStr(pLVar6,str,logging_function_06,source_file,0x86,LEVELDB,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  pLVar5 = DBContext(this);
  pOVar11 = &options;
  pOVar12 = &pLVar5->options;
  for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
    pOVar12->comparator = pOVar11->comparator;
    pOVar11 = (Options *)((long)pOVar11 + (ulong)bVar13 * -0x10 + 8);
    pOVar12 = (Options *)((long)pOVar12 + (ulong)bVar13 * -0x10 + 8);
  }
  pLVar5 = DBContext(this);
  (pLVar5->options).create_if_missing = true;
  if (params->memory_only == true) {
    pEVar7 = leveldb::Env::Default();
    pEVar7 = leveldb::NewMemEnv(pEVar7);
    pLVar5 = DBContext(this);
    pLVar5->penv = pEVar7;
    pLVar5 = DBContext(this);
    pEVar7 = pLVar5->penv;
    pLVar5 = DBContext(this);
    (pLVar5->options).env = pEVar7;
  }
  else {
    if (params->wipe_data == true) {
      std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
      logging_function._M_str = "CDBWrapper";
      logging_function._M_len = 10;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file_00._M_len = 0x56;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file_00,0xec,
                 I2P|VALIDATION|QT|COINDB|LIBEVENT|REINDEX|ADDRMAN|RPC|ZMQ|BENCH|TOR,(Level)&options
                 ,in_stack_fffffffffffffe70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe78);
      std::__cxx11::string::~string((string *)&options);
      std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
      pLVar5 = DBContext(this);
      leveldb::DestroyDB((leveldb *)&log_msg,(string *)&options,&pLVar5->options);
      std::__cxx11::string::~string((string *)&options);
      HandleError((Status *)&log_msg);
      leveldb::Status::~Status((Status *)&log_msg);
    }
    TryCreateDirectories(&params->path);
    std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
    logging_function_00._M_str = "CDBWrapper";
    logging_function_00._M_len = 10;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file_01._M_len = 0x56;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_01,0xf1,
               I2P|VALIDATION|QT|COINDB|LIBEVENT|REINDEX|ADDRMAN|RPC|WALLETDB|HTTP,(Level)&options,
               in_stack_fffffffffffffe70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe78);
    std::__cxx11::string::~string((string *)&options);
  }
  pLVar5 = DBContext(this);
  std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
  pLVar8 = DBContext(this);
  leveldb::DB::Open((DB *)&status,&pLVar5->options,(string *)&options,&pLVar8->pdb);
  std::__cxx11::string::~string((string *)&options);
  HandleError(&status);
  fmt = "Opened LevelDB successfully\n";
  logging_function_01._M_str = "CDBWrapper";
  logging_function_01._M_len = 10;
  source_file_02._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
  source_file_02._M_len = 0x56;
  ::LogPrintf_<>(logging_function_01,source_file_02,0xf9,ALL,Info,"Opened LevelDB successfully\n");
  if ((params->options).force_compact == true) {
    std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
    logging_function_02._M_str = "CDBWrapper";
    logging_function_02._M_len = 10;
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file_03._M_len = 0x56;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_02,source_file_03,0xfc,
               I2P|VALIDATION|QT|COINDB|LIBEVENT|REINDEX|ADDRMAN|RPC|WALLETDB|ZMQ|BENCH|HTTP|MEMPOOL
               ,(Level)&options,fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe78);
    std::__cxx11::string::~string((string *)&options);
    pLVar5 = DBContext(this);
    (*pLVar5->pdb->_vptr_DB[0xb])(pLVar5->pdb,0,0);
    std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
    logging_function_03._M_str = "CDBWrapper";
    logging_function_03._M_len = 10;
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
    source_file_04._M_len = 0x56;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_03,source_file_04,0xfe,
               I2P|VALIDATION|QT|COINDB|LIBEVENT|REINDEX|ADDRMAN|ESTIMATEFEE|ZMQ,(Level)&options,fmt
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffffe78);
    std::__cxx11::string::~string((string *)&options);
  }
  log_msg._M_dataplus._M_p = log_msg._M_dataplus._M_p & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&options,8,
             (value_type_conflict *)&log_msg,(allocator_type *)&new_key);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(value,&options);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&options);
  this_00 = &OBFUSCATE_KEY_KEY_abi_cxx11_;
  bVar4 = Read<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (this,&OBFUSCATE_KEY_KEY_abi_cxx11_,value);
  if ((!bVar4) && (params->obfuscate == true)) {
    bVar4 = IsEmpty(this);
    if (bVar4) {
      CreateObfuscateKey(&new_key,(CDBWrapper *)this_00);
      Write<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (this,&OBFUSCATE_KEY_KEY_abi_cxx11_,&new_key,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(value,&new_key);
      std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
      puVar3 = (this->obfuscate_key).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      s.m_size = (long)(this->obfuscate_key).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar3;
      s.m_data = puVar3;
      HexStr_abi_cxx11_(&log_msg,s);
      logging_function_04._M_str = "CDBWrapper";
      logging_function_04._M_len = 10;
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
      source_file_05._M_len = 0x56;
      LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                (logging_function_04,source_file_05,0x10f,
                 I2P|VALIDATION|QT|COINDB|LIBEVENT|REINDEX|ADDRMAN|ESTIMATEFEE|WALLETDB|MEMPOOL,
                 (Level)&options,(char *)&log_msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      std::__cxx11::string::~string((string *)&log_msg);
      std::__cxx11::string::~string((string *)&options);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
  }
  std::filesystem::__cxx11::path::string((string *)&options,(path *)params);
  puVar3 = (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  s_00.m_size = (long)(this->obfuscate_key).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3;
  s_00.m_data = puVar3;
  HexStr_abi_cxx11_(&log_msg,s_00);
  logging_function_05._M_str = "CDBWrapper";
  logging_function_05._M_len = 10;
  source_file_06._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/dbwrapper.cpp";
  source_file_06._M_len = 0x56;
  LogPrintf_<std::__cxx11::string,std::__cxx11::string>
            (logging_function_05,source_file_06,0x112,
             I2P|VALIDATION|QT|COINDB|LIBEVENT|REINDEX|ADDRMAN|ESTIMATEFEE|WALLETDB|ZMQ|HTTP,
             (Level)&options,(char *)&log_msg,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  std::__cxx11::string::~string((string *)&log_msg);
  std::__cxx11::string::~string((string *)&options);
  leveldb::Status::~Status(&status);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CDBWrapper::CDBWrapper(const DBParams& params)
    : m_db_context{std::make_unique<LevelDBContext>()}, m_name{fs::PathToString(params.path.stem())}, m_path{params.path}, m_is_memory{params.memory_only}
{
    DBContext().penv = nullptr;
    DBContext().readoptions.verify_checksums = true;
    DBContext().iteroptions.verify_checksums = true;
    DBContext().iteroptions.fill_cache = false;
    DBContext().syncoptions.sync = true;
    DBContext().options = GetOptions(params.cache_bytes);
    DBContext().options.create_if_missing = true;
    if (params.memory_only) {
        DBContext().penv = leveldb::NewMemEnv(leveldb::Env::Default());
        DBContext().options.env = DBContext().penv;
    } else {
        if (params.wipe_data) {
            LogPrintf("Wiping LevelDB in %s\n", fs::PathToString(params.path));
            leveldb::Status result = leveldb::DestroyDB(fs::PathToString(params.path), DBContext().options);
            HandleError(result);
        }
        TryCreateDirectories(params.path);
        LogPrintf("Opening LevelDB in %s\n", fs::PathToString(params.path));
    }
    // PathToString() return value is safe to pass to leveldb open function,
    // because on POSIX leveldb passes the byte string directly to ::open(), and
    // on Windows it converts from UTF-8 to UTF-16 before calling ::CreateFileW
    // (see env_posix.cc and env_windows.cc).
    leveldb::Status status = leveldb::DB::Open(DBContext().options, fs::PathToString(params.path), &DBContext().pdb);
    HandleError(status);
    LogPrintf("Opened LevelDB successfully\n");

    if (params.options.force_compact) {
        LogPrintf("Starting database compaction of %s\n", fs::PathToString(params.path));
        DBContext().pdb->CompactRange(nullptr, nullptr);
        LogPrintf("Finished database compaction of %s\n", fs::PathToString(params.path));
    }

    // The base-case obfuscation key, which is a noop.
    obfuscate_key = std::vector<unsigned char>(OBFUSCATE_KEY_NUM_BYTES, '\000');

    bool key_exists = Read(OBFUSCATE_KEY_KEY, obfuscate_key);

    if (!key_exists && params.obfuscate && IsEmpty()) {
        // Initialize non-degenerate obfuscation if it won't upset
        // existing, non-obfuscated data.
        std::vector<unsigned char> new_key = CreateObfuscateKey();

        // Write `new_key` so we don't obfuscate the key with itself
        Write(OBFUSCATE_KEY_KEY, new_key);
        obfuscate_key = new_key;

        LogPrintf("Wrote new obfuscate key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
    }

    LogPrintf("Using obfuscation key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
}